

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

void BackwardReferences2DLocality(int xsize,VP8LBackwardRefs *refs)

{
  int iVar1;
  uint32_t uVar2;
  VP8LBackwardRefs *in_RSI;
  int in_EDI;
  int transformed_dist;
  int dist;
  VP8LRefsCursor c;
  VP8LRefsCursor local_28;
  int local_4;
  
  local_4 = in_EDI;
  VP8LRefsCursorInit(&local_28,in_RSI);
  while( true ) {
    iVar1 = VP8LRefsCursorOk(&local_28);
    if (iVar1 == 0) break;
    iVar1 = PixOrCopyIsCopy(local_28.cur_pos);
    if (iVar1 != 0) {
      uVar2 = VP8LDistanceToPlaneCode(local_4,(local_28.cur_pos)->argb_or_distance);
      (local_28.cur_pos)->argb_or_distance = uVar2;
    }
    VP8LRefsCursorNext((VP8LRefsCursor *)0x19922d);
  }
  return;
}

Assistant:

static void BackwardReferences2DLocality(int xsize,
                                         const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    if (PixOrCopyIsCopy(c.cur_pos)) {
      const int dist = c.cur_pos->argb_or_distance;
      const int transformed_dist = VP8LDistanceToPlaneCode(xsize, dist);
      c.cur_pos->argb_or_distance = transformed_dist;
    }
    VP8LRefsCursorNext(&c);
  }
}